

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O1

string * __thiscall
deqp::sl::ShaderCase::genVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,ShaderCase *this,ValueBlock *valueBlock)

{
  GLSLVersion version;
  bool bVar1;
  DataType DVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  pointer pVVar9;
  long lVar10;
  bool bVar11;
  ostringstream res;
  ValueBlock *local_1d8;
  string *local_1d0;
  long local_1c8;
  char *local_1c0;
  char *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [376];
  
  local_1d8 = valueBlock;
  local_1d0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  version = this->m_targetVersion;
  bVar11 = GLSL_VERSION_150 < version;
  bVar6 = 0xe >> ((byte)version & 0x1f);
  local_1b8 = "attribute";
  bVar1 = (bVar6 & 1) != 0;
  if (bVar1 || bVar11) {
    local_1b8 = "in";
  }
  local_1c0 = "varying";
  if (bVar1 || bVar11) {
    local_1c0 = "out";
  }
  pcVar3 = glu::getGLSLVersionDeclaration(version);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)&local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision highp float;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision highp int;\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  local_1b0 = 9;
  if ((bVar6 & 1) != 0 || bVar11) {
    local_1b0 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1b8,local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8," highp vec4 dEQP_Position;\n",0x1b);
  pVVar9 = (local_1d8->values).
           super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_1d8->values).
                              super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9) >> 3) *
          0x38e38e39) {
    local_1c8 = (ulong)((byte)~(bVar6 | bVar11) & 1) * 4 + 3;
    lVar10 = 0x28;
    lVar8 = 0;
    do {
      if (*(int *)((long)pVVar9 + lVar10 + -0x28) == 1) {
        DVar2 = glu::getDataTypeFloatScalars(*(DataType *)((long)&pVVar9->storageType + lVar10));
        pcVar3 = glu::getDataTypeName(DVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1b8,local_1b0)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)&local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
        }
        else {
          sVar4 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," a_",3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)((long)pVVar9 + lVar10 + -0x20),
                            *(long *)((long)pVVar9 + lVar10 + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
        DVar2 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar9->storageType + lVar10));
        if (DVar2 == TYPE_FLOAT) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_1c0,local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          if (pcVar3 == (char *)0x0) {
            lVar7 = 1;
            std::ios::clear((int)&local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
            pcVar3 = " ";
          }
          else {
            sVar4 = strlen(pcVar3);
            lVar7 = 1;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
            pcVar3 = " ";
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_1c0,local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          if (pcVar3 == (char *)0x0) {
            lVar7 = 3;
            std::ios::clear((int)&local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
            pcVar3 = " v_";
          }
          else {
            sVar4 = strlen(pcVar3);
            lVar7 = 3;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
            pcVar3 = " v_";
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,lVar7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)((long)pVVar9 + lVar10 + -0x20),
                            *(long *)((long)pVVar9 + lVar10 + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
      }
      lVar8 = lVar8 + 1;
      pVVar9 = (local_1d8->values).
               super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x48;
    } while (lVar8 < (int)((ulong)((long)(local_1d8->values).
                                         super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9)
                          >> 3) * 0x38e38e39);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    gl_Position = dEQP_Position;\n",0x21);
  pVVar9 = (local_1d8->values).
           super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_1d8->values).
                              super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9) >> 3) *
          0x38e38e39) {
    lVar10 = 0;
    lVar8 = 0;
    do {
      if (*(int *)((long)&pVVar9->storageType + lVar10) == 1) {
        DVar2 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar9->dataType + lVar10));
        if (DVar2 == TYPE_FLOAT) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,
                              *(char **)((long)&(pVVar9->valueName)._M_dataplus._M_p + lVar10),
                              *(long *)((long)&(pVVar9->valueName)._M_string_length + lVar10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," = a_",5);
          lVar7 = lVar10;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    v_",6);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,
                              *(char **)((long)&(pVVar9->valueName)._M_dataplus._M_p + lVar10),
                              *(long *)((long)&(pVVar9->valueName)._M_string_length + lVar10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," = a_",5);
          lVar7 = lVar8 * 0x48;
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,*(char **)((long)&(pVVar9->valueName)._M_dataplus._M_p + lVar10),
                            *(long *)((long)&(pVVar9->valueName)._M_string_length + lVar7));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
      }
      lVar8 = lVar8 + 1;
      pVVar9 = (local_1d8->values).
               super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x48;
    } while (lVar8 < (int)((ulong)((long)(local_1d8->values).
                                         super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9)
                          >> 3) * 0x38e38e39);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_1d0;
}

Assistant:

string ShaderCase::genVertexShader(const ValueBlock& valueBlock)
{
	ostringstream res;
	const bool	usesInout = usesShaderInoutQualifiers(m_targetVersion);
	const char*   vtxIn		= usesInout ? "in" : "attribute";
	const char*   vtxOut	= usesInout ? "out" : "varying";

	res << glu::getGLSLVersionDeclaration(m_targetVersion) << "\n";

	// Declarations (position + attribute/varying for each input).
	res << "precision highp float;\n";
	res << "precision highp int;\n";
	res << "\n";
	res << vtxIn << " highp vec4 dEQP_Position;\n";
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val = valueBlock.values[ndx];
		if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
		{
			DataType	floatType = getDataTypeFloatScalars(val.dataType);
			const char* typeStr   = getDataTypeName(floatType);
			res << vtxIn << " " << typeStr << " a_" << val.valueName << ";\n";

			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				res << vtxOut << " " << typeStr << " " << val.valueName << ";\n";
			else
				res << vtxOut << " " << typeStr << " v_" << val.valueName << ";\n";
		}
	}
	res << "\n";

	// Main function.
	// - gl_Position = dEQP_Position;
	// - for each input: write attribute directly to varying
	res << "void main()\n";
	res << "{\n";
	res << "    gl_Position = dEQP_Position;\n";
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val = valueBlock.values[ndx];
		if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
		{
			const string& name = val.valueName;
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				res << "    " << name << " = a_" << name << ";\n";
			else
				res << "    v_" << name << " = a_" << name << ";\n";
		}
	}

	res << "}\n";
	return res.str();
}